

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O3

HeapType __thiscall
wasm::TranslateToFuzzReader::getSuperType(TranslateToFuzzReader *this,HeapType type)

{
  uintptr_t uVar1;
  HeapType HVar2;
  value_type *pvVar3;
  undefined1 auVar4 [16];
  HeapType local_40;
  HeapType type_local;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> supers;
  
  type_local.id = 0;
  supers.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  HVar2.id = type.id;
  do {
    local_40.id = HVar2.id;
    if (supers.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>::
      _M_realloc_insert<wasm::HeapType_const&>
                ((vector<wasm::HeapType,std::allocator<wasm::HeapType>> *)&type_local,(iterator)0x0,
                 &local_40);
    }
    else {
      (supers.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
       super__Vector_impl_data._M_start)->id = (uintptr_t)local_40;
      supers.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
      super__Vector_impl_data._M_start =
           supers.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
           super__Vector_impl_data._M_start + 1;
    }
    auVar4 = ::wasm::HeapType::getSuperType();
    HVar2.id = auVar4._0_8_;
  } while ((auVar4 & (undefined1  [16])0x1) != (undefined1  [16])0x0);
  pvVar3 = Random::pick<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
                     (&this->random,
                      (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&type_local);
  uVar1 = pvVar3->id;
  if (type_local.id != 0) {
    operator_delete((void *)type_local.id,-type_local.id);
  }
  return (HeapType)uVar1;
}

Assistant:

HeapType TranslateToFuzzReader::getSuperType(HeapType type) {
  // TODO cache these?
  std::vector<HeapType> supers;
  while (1) {
    supers.push_back(type);
    if (auto super = type.getSuperType()) {
      type = *super;
    } else {
      break;
    }
  }
  return pick(supers);
}